

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crab-combat.cpp
# Opt level: O2

hash_type __thiscall game_hasher::operator()(game_hasher *this,game_t *game)

{
  _Elt_pointer puVar1;
  _Map_pointer ppuVar2;
  ulong uVar3;
  _Elt_pointer puVar4;
  long lVar5;
  deque<unsigned_long,_std::allocator<unsigned_long>_> g;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_c0;
  deque<unsigned_long,_std::allocator<unsigned_long>_> local_70;
  
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::deque
            ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_c0,&game->first);
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::deque(&local_70,&game->second);
  uVar3 = 0;
  for (lVar5 = 0; lVar5 != 0xa0; lVar5 = lVar5 + 0x50) {
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::deque
              ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)
               &g.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>,
               (deque<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&local_c0._M_impl.super__Deque_impl_data._M_map + lVar5));
    puVar1 = g.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    ppuVar2 = g.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    puVar4 = g.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
    while (puVar1 != g.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur) {
      uVar3 = uVar3 ^ (uVar3 >> 2) + uVar3 * 0x40 + 0x9e3779b9 + (long)(int)*puVar1;
      puVar1 = puVar1 + 1;
      if (puVar1 == puVar4) {
        puVar1 = ppuVar2[1];
        ppuVar2 = ppuVar2 + 1;
        puVar4 = puVar1 + 0x40;
      }
    }
    std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
              (&g.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  lVar5 = 0x50;
  do {
    std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
              ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&local_c0._M_impl.super__Deque_impl_data._M_map + lVar5));
    lVar5 = lVar5 + -0x50;
  } while (lVar5 != -0x50);
  return uVar3;
}

Assistant:

hash_type operator()(const game_t & game) const {
    std::size_t h = 0;
    for (auto g : {game.first, game.second})
      for (auto c : g)
        h ^= std::hash<int>{}(c)  + 0x9e3779b9 + (h << 6u) + (h >> 2u);
    return h;
  }